

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ValueArg(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,string *flag,string *name,string *desc,bool req,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,string *typeDesc,
        Visitor *v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_local;
  bool req_local;
  string *desc_local;
  string *name_local;
  string *flag_local;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  Arg::Arg(&this->super_Arg,flag,name,desc,req,true,v);
  (this->super_Arg)._vptr_Arg = (_func_int **)&PTR__ValueArg_001ec788;
  std::__cxx11::string::string((string *)&this->_value,(string *)val);
  std::__cxx11::string::string((string *)&this->_default,(string *)val);
  std::__cxx11::string::string((string *)&this->_typeDesc,(string *)typeDesc);
  this->_constraint =
       (Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ }